

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
KickGameCommand::trigger
          (KickGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  PlayerInfo *pPVar1;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  size_t sVar3;
  undefined8 uStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  split_parameters;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_str;
  local_90._M_dataplus._M_p = (pointer)parameters._M_len;
  local_70._M_len = 2;
  local_70._M_str = " \t";
  local_90._M_string_length = (size_type)args_2;
  jessilib::
  word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&split_parameters,(basic_string_view<char,_std::char_traits<char>_> *)&local_90,
             &local_70);
  if (split_parameters.first._M_len == 0) {
    pcVar2 = "Error: Too few parameters. Syntax: kick <player> [Reason]";
    uStack_a0 = 0x39;
  }
  else {
    pcVar2 = "No reason";
    if (split_parameters.second._M_len != 0) {
      pcVar2 = split_parameters.second._M_str;
    }
    sVar3 = 9;
    if (split_parameters.second._M_len != 0) {
      sVar3 = split_parameters.second._M_len;
    }
    pPVar1 = (PlayerInfo *)
             RenX::Server::getPlayerByPartName
                       (source,split_parameters.first._M_len,split_parameters.first._M_str);
    if (pPVar1 == (PlayerInfo *)0x0) {
      pcVar2 = "Error: Player not found.";
      uStack_a0 = 0x18;
    }
    else if (pPVar1 == player) {
      pcVar2 = "Error: You cannot kick yourself.";
      uStack_a0 = 0x20;
    }
    else {
      if (player->access <= pPVar1->access) {
        local_70._M_len = 0x25;
        local_70._M_str = "Error: You can not kick higher level ";
        local_30._M_len = pluginInstance.m_staffTitle._M_string_length;
        local_30._M_str = pluginInstance.m_staffTitle._M_dataplus._M_p;
        local_40._M_len = 2;
        local_40._M_str = "s.";
        jessilib::
        join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  (&local_90,(jessilib *)&local_70,&local_30,&local_40,args_2);
        RenX::Server::sendMessage(source,player,local_90._M_string_length,local_90._M_dataplus._M_p)
        ;
        std::__cxx11::string::~string((string *)&local_90);
        return;
      }
      RenX::Server::kickPlayer(source,pPVar1,sVar3,pcVar2);
      pcVar2 = "Player has been kicked from the game.";
      uStack_a0 = 0x25;
    }
  }
  RenX::Server::sendMessage(source,player,uStack_a0,pcVar2);
  return;
}

Assistant:

void KickGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	auto split_parameters = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!split_parameters.first.empty()) {
		std::string_view reason = split_parameters.second;
		if (reason.empty()) {
			reason = "No reason"sv;
		}

		RenX::PlayerInfo *target = source->getPlayerByPartName(split_parameters.first);
		if (target == nullptr) {
			source->sendMessage(*player, "Error: Player not found."sv);
		}
		else if (player == target) {
			source->sendMessage(*player, "Error: You cannot kick yourself."sv);
		}
		else if (target->access >= player->access) {
			source->sendMessage(*player, jessilib::join<std::string>("Error: You can not kick higher level "sv, pluginInstance.getStaffTitle(), "s."sv));
		}
		else
		{
			source->kickPlayer(*target, reason);
			source->sendMessage(*player, "Player has been kicked from the game."sv);
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: kick <player> [Reason]"sv);
}